

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uncompr.c
# Opt level: O2

int uncompress2(Bytef *dest,uLongf *destLen,Bytef *source,uLong *sourceLen)

{
  int iVar1;
  ulong uVar2;
  uLongf uVar3;
  uLong uVar4;
  Byte buf [1];
  z_stream local_a0;
  
  uVar4 = *sourceLen;
  uVar3 = *destLen;
  if (uVar3 == 0) {
    uVar3 = 1;
    dest = buf;
  }
  else {
    *destLen = 0;
  }
  local_a0.avail_in = 0;
  local_a0.zalloc = (alloc_func)0x0;
  local_a0.zfree = (free_func)0x0;
  local_a0.opaque = (voidpf)0x0;
  local_a0.next_in = source;
  iVar1 = inflateInit_(&local_a0,"1.3.1",0x70);
  if (iVar1 != 0) {
    return iVar1;
  }
  local_a0.avail_out = 0;
  local_a0.next_out = dest;
  do {
    if (local_a0.avail_out == 0) {
      uVar2 = 0xffffffff;
      if (uVar3 < 0xffffffff) {
        uVar2 = uVar3;
      }
      local_a0.avail_out = (uInt)uVar2;
      uVar3 = uVar3 - uVar2;
    }
    if (local_a0.avail_in == 0) {
      uVar2 = 0xffffffff;
      if (uVar4 < 0xffffffff) {
        uVar2 = uVar4;
      }
      local_a0.avail_in = (uInt)uVar2;
      uVar4 = uVar4 - uVar2;
    }
    iVar1 = inflate(&local_a0,0);
  } while (iVar1 == 0);
  *sourceLen = *sourceLen - (uVar4 + local_a0.avail_in);
  if (dest == buf) {
    uVar2 = 1;
    if (local_a0.total_out == 0) {
      uVar2 = uVar3;
    }
    if (iVar1 == -5) {
      uVar3 = uVar2;
    }
  }
  else {
    *destLen = local_a0.total_out;
  }
  inflateEnd(&local_a0);
  if (iVar1 != 2) {
    if (iVar1 == 1) {
      return 0;
    }
    if (iVar1 != -5) {
      return iVar1;
    }
    if (uVar3 + local_a0.avail_out == 0) {
      return -5;
    }
  }
  return -3;
}

Assistant:

int ZEXPORT uncompress2(Bytef *dest, uLongf *destLen, const Bytef *source,
                        uLong *sourceLen) {
    z_stream stream;
    int err;
    const uInt max = (uInt)-1;
    uLong len, left;
    Byte buf[1];    /* for detection of incomplete stream when *destLen == 0 */

    len = *sourceLen;
    if (*destLen) {
        left = *destLen;
        *destLen = 0;
    }
    else {
        left = 1;
        dest = buf;
    }

    stream.next_in = (z_const Bytef *)source;
    stream.avail_in = 0;
    stream.zalloc = (alloc_func)0;
    stream.zfree = (free_func)0;
    stream.opaque = (voidpf)0;

    err = inflateInit(&stream);
    if (err != Z_OK) return err;

    stream.next_out = dest;
    stream.avail_out = 0;

    do {
        if (stream.avail_out == 0) {
            stream.avail_out = left > (uLong)max ? max : (uInt)left;
            left -= stream.avail_out;
        }
        if (stream.avail_in == 0) {
            stream.avail_in = len > (uLong)max ? max : (uInt)len;
            len -= stream.avail_in;
        }
        err = inflate(&stream, Z_NO_FLUSH);
    } while (err == Z_OK);

    *sourceLen -= len + stream.avail_in;
    if (dest != buf)
        *destLen = stream.total_out;
    else if (stream.total_out && err == Z_BUF_ERROR)
        left = 1;

    inflateEnd(&stream);
    return err == Z_STREAM_END ? Z_OK :
           err == Z_NEED_DICT ? Z_DATA_ERROR  :
           err == Z_BUF_ERROR && left + stream.avail_out ? Z_DATA_ERROR :
           err;
}